

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

string * backward::TraceResolverLinuxBase::get_argv0_abi_cxx11_(void)

{
  string *in_RDI;
  ifstream ifs;
  string *argv0;
  istream local_218 [527];
  byte local_9;
  
  local_9 = 0;
  std::__cxx11::string::string(in_RDI);
  std::ifstream::ifstream(local_218,"/proc/self/cmdline",8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,in_RDI,'\0');
  local_9 = 1;
  std::ifstream::~ifstream(local_218);
  if ((local_9 & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

static std::string get_argv0() {
    std::string argv0;
    std::ifstream ifs("/proc/self/cmdline");
    std::getline(ifs, argv0, '\0');
    return argv0;
  }